

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QRect __thiscall QWidgetPrivate::frameStrut(QWidgetPrivate *this)

{
  long lVar1;
  QRect QVar2;
  bool bVar3;
  WindowType WVar4;
  QTLWExtra *pQVar5;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *q;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  WidgetAttribute in_stack_ffffffffffffffc4;
  QWidget *in_stack_ffffffffffffffc8;
  QWidgetPrivate *in_stack_ffffffffffffffe8;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar3 = QWidget::isWindow((QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                           );
  if (((!bVar3) ||
      (WVar4 = QWidget::windowType((QWidget *)
                                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
      WVar4 == Desktop)) ||
     (bVar3 = QWidget::testAttribute(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4), bVar3)) {
    QRect::QRect((QRect *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  }
  else {
    if ((((*(uint *)&(in_RDI->data).field_0x10 >> 0xc & 1) != 0) &&
        (bVar3 = QWidget::isVisible((QWidget *)0x369d0f), bVar3)) &&
       (bVar3 = QWidget::testAttribute(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4), bVar3))
    {
      updateFrameStrut(in_stack_ffffffffffffffe8);
    }
    pQVar5 = maybeTopData((QWidgetPrivate *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (pQVar5 == (QTLWExtra *)0x0) {
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    else {
      pQVar5 = maybeTopData((QWidgetPrivate *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      in_stack_ffffffffffffffe8 = *(QWidgetPrivate **)&pQVar5->frameStrut;
      local_10._0_4_ = (pQVar5->frameStrut).x2;
      local_10._4_4_ = (pQVar5->frameStrut).y2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar2.x2.m_i = (undefined4)local_10;
  QVar2.y2.m_i = local_10._4_4_;
  QVar2._0_8_ = in_stack_ffffffffffffffe8;
  return QVar2;
}

Assistant:

QRect QWidgetPrivate::frameStrut() const
{
    Q_Q(const QWidget);
    if (!q->isWindow() || (q->windowType() == Qt::Desktop) || q->testAttribute(Qt::WA_DontShowOnScreen)) {
        // x2 = x1 + w - 1, so w/h = 1
        return QRect(0, 0, 1, 1);
    }

    if (data.fstrut_dirty
        // ### Fix properly for 4.3
        && q->isVisible()
        && q->testAttribute(Qt::WA_WState_Created))
        const_cast<QWidgetPrivate *>(this)->updateFrameStrut();

    return maybeTopData() ? maybeTopData()->frameStrut : QRect();
}